

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK4.cpp
# Opt level: O0

void __thiscall iDynTree::optimalcontrol::integrators::RK4::RK4(RK4 *this)

{
  element_type *peVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  undefined8 *in_RDI;
  Index in_stack_00000018;
  Index in_stack_00000020;
  SparseMatrix<double,_0,_int> *in_stack_00000028;
  Index in_stack_ffffffffffffff38;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff40;
  Index in_stack_ffffffffffffff48;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff50;
  
  FixedStepIntegrator::FixedStepIntegrator((FixedStepIntegrator *)in_stack_ffffffffffffff50);
  *in_RDI = &PTR__RK4_003fb2b8;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(in_stack_ffffffffffffff50);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x382c89);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x382ca7);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff50);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x1b));
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x382cfb);
  peVar1->isExplicit = true;
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x382d09);
  peVar1->numberOfStages = 4;
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x382d1b);
  std::__cxx11::string::operator=((string *)peVar1,"RK4");
  Eigen::SparseMatrix<double,_0,_int>::resize
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(Index)in_stack_ffffffffffffff40);
  Eigen::SparseMatrix<double,_0,_int>::reserve(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018);
  *pSVar2 = 0.3333333333333333;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018);
  *pSVar2 = -0.3333333333333333;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018);
  *pSVar2 = 1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018);
  *pSVar2 = 1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018);
  *pSVar2 = -1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018);
  *pSVar2 = 1.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 0.125;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 0.375;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 0.375;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 0.125;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 0.3333333333333333;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 0.6666666666666666;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *pSVar3 = 1.0;
  return;
}

Assistant:

RK4::RK4()
            {
                m_infoData->isExplicit = true;
                m_infoData->numberOfStages = 4;
                m_infoData->name = "RK4";

                m_aCoefficents.resize(4,4);
                m_aCoefficents.reserve(6);
                m_aCoefficents.insert(1,0) =  1.0/3.0;
                m_aCoefficents.insert(2,0) = -1.0/3.0;
                m_aCoefficents.insert(2,1) =   1.0;
                m_aCoefficents.insert(3,0) =   1.0;
                m_aCoefficents.insert(3,1) =  -1.0;
                m_aCoefficents.insert(3,2) =   1.0;

                m_bCoefficients.resize(4);
                m_bCoefficients(0) = 1.0/8.0;
                m_bCoefficients(1) = 3.0/8.0;
                m_bCoefficients(2) = 3.0/8.0;
                m_bCoefficients(3) = 1.0/8.0;
                m_cCoefficients.resize(4);
                m_cCoefficients(0) = 0.0;
                m_cCoefficients(1) = 1.0/3.0;
                m_cCoefficients(2) = 2.0/3.0;
                m_cCoefficients(3) = 1.0;
            }